

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_d185f6::DirectoryObject::DumpInstaller
          (Value *__return_storage_ptr__,DirectoryObject *this,cmInstallGenerator *gen)

{
  size_t *this_00;
  pointer *this_01;
  NamelinkModeType NVar1;
  unordered_map<const_cmGeneratorTarget_*,_unsigned_int,_std::hash<const_cmGeneratorTarget_*>,_std::equal_to<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>_>
  *this_02;
  bool bVar2;
  DependencyType DVar3;
  Value *pVVar4;
  cmGeneratorTarget *gt;
  mapped_type *pmVar5;
  ulong uVar6;
  string *psVar7;
  const_reference pvVar8;
  size_type sVar9;
  cmInstallRuntimeDependencySet *this_03;
  cmFileSet *this_04;
  cmLocalGenerator *pcVar10;
  reference cge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  reference fromPathIn;
  string *psVar12;
  cmListFileBacktrace *bt;
  string_view str;
  cmInstallCxxModuleBmiGenerator *local_1548;
  cmInstallFileSetGenerator *local_1430;
  cmInstallRuntimeDependencySetGenerator *local_13c0;
  cmInstallImportedRuntimeArtifactsGenerator *local_1380;
  cmInstallScriptGenerator *local_1340;
  cmInstallExportGenerator *local_12c0;
  cmInstallDirectoryGenerator *local_1248;
  cmInstallFilesGenerator *local_11f8;
  cmInstallTargetGenerator *local_1140;
  long local_1128;
  long local_1118;
  Value local_10f0;
  Value local_10c8;
  Value local_10a0;
  Value local_1078;
  Value local_1050;
  string local_1028;
  Value local_1008;
  Value local_fe0;
  cmGeneratorTarget *local_fb8;
  cmGeneratorTarget *target_1;
  Value local_f90;
  Value local_f68;
  cmInstallCxxModuleBmiGenerator *local_f40;
  cmInstallCxxModuleBmiGenerator *cxxModuleBmi;
  Value local_f10;
  string local_ee8;
  Value local_ec8;
  Value local_ea0;
  string local_e78;
  Value local_e58;
  string *local_e30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dir_2;
  iterator __end9_2;
  iterator __begin9_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range9_2;
  Value local_de8;
  Value local_dc0;
  string local_d98;
  cmAlphaNum local_d78;
  cmAlphaNum local_d48;
  string local_d18;
  Value local_cf8;
  string *local_cd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file_1;
  const_iterator __end10;
  const_iterator __begin10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> dir_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *it;
  iterator __end9_1;
  iterator __begin9_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *__range9_1;
  Value files_2;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entryCge;
  iterator __end9;
  iterator __begin9;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  *__range9;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  entries;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  entryCges;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs_1;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  dirCges;
  cmGeneratorTarget *target;
  cmFileSet *fileSet;
  Value local_b80;
  Value local_b58;
  cmInstallFileSetGenerator *local_b30;
  cmInstallFileSetGenerator *installFileSet;
  Value local_b00;
  Value local_ad8;
  allocator<char> local_aa9;
  string_view local_aa8;
  undefined1 local_a98 [8];
  string name;
  Value local_a58;
  Value local_a30;
  cmInstallRuntimeDependencySetGenerator *local_a08;
  cmInstallRuntimeDependencySetGenerator *installRuntimeDependencySet;
  string local_9d8;
  Value local_9b8;
  Value local_990;
  cmInstallImportedRuntimeArtifactsGenerator *local_968;
  cmInstallImportedRuntimeArtifactsGenerator *installImportedRuntimeArtifacts;
  string local_940;
  Value local_920;
  Value local_8f8;
  Value local_8d0;
  cmInstallScriptGenerator *local_8a8;
  cmInstallScriptGenerator *installScript;
  Value local_880;
  undefined1 local_858 [8];
  Value paths_3;
  Value local_808;
  cmExportSet *local_7e0;
  cmExportSet *exportSet;
  Value local_7b0;
  cmInstallExportGenerator *local_788;
  cmInstallExportGenerator *installExport;
  string local_758;
  Value local_738;
  allocator<char> local_709;
  string local_708;
  string local_6e8;
  Value local_6c8;
  string_view local_6a0;
  string *local_690;
  string *dir;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4_1;
  Value paths_2;
  Value local_628;
  Value local_600;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_5c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dirs;
  cmInstallDirectoryGenerator *installDir;
  string local_588;
  Value local_568;
  reference local_540;
  string *file;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  string local_4e0;
  string *local_4c0;
  string *rename;
  Value paths_1;
  Value local_470;
  Value local_448;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_420;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_408;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_1;
  cmInstallFilesGenerator *installFiles;
  Value local_3d0;
  Value local_3a8;
  Value local_380;
  Value local_358;
  cmAlphaNum local_330;
  cmAlphaNum local_300;
  string local_2d0;
  string *local_2b0;
  string *toPath;
  cmAlphaNum local_278;
  string local_248;
  string *local_228;
  string *fromPath;
  size_t i;
  Value paths;
  string toDir;
  string fromDir;
  Value local_1a8;
  string local_180;
  Value local_160;
  string local_138;
  Value local_118;
  Value local_f0;
  Files local_c8;
  Files *local_48;
  Files *files;
  cmInstallTargetGenerator *installTarget;
  int local_28;
  byte local_21;
  cmInstallGenerator *local_20;
  cmInstallGenerator *gen_local;
  DirectoryObject *this_local;
  Value *installer;
  
  local_20 = gen;
  gen_local = (cmInstallGenerator *)this;
  this_local = (DirectoryObject *)__return_storage_ptr__;
  if (gen == (cmInstallGenerator *)0x0) {
    __assert_fail("gen",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFileAPICodemodel.cxx"
                  ,0x373,
                  "Json::Value (anonymous namespace)::DirectoryObject::DumpInstaller(cmInstallGenerator *)"
                 );
  }
  local_21 = 0;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  if (local_20 == (cmInstallGenerator *)0x0) {
    local_1118 = 0;
  }
  else {
    local_1118 = __dynamic_cast(local_20,&cmInstallGenerator::typeinfo,
                                &cmInstallSubdirectoryGenerator::typeinfo,0);
  }
  if (local_1118 == 0) {
    if (local_20 == (cmInstallGenerator *)0x0) {
      local_1128 = 0;
    }
    else {
      local_1128 = __dynamic_cast(local_20,&cmInstallGenerator::typeinfo,
                                  &cmInstallGetRuntimeDependenciesGenerator::typeinfo,0);
    }
    if (local_1128 == 0) {
      bVar2 = cmInstallGenerator::InstallsForConfig(local_20,this->Config);
      if (!bVar2) {
        local_21 = 1;
        local_28 = 1;
        goto LAB_0067974b;
      }
      if (local_20 == (cmInstallGenerator *)0x0) {
        local_1140 = (cmInstallTargetGenerator *)0x0;
      }
      else {
        local_1140 = (cmInstallTargetGenerator *)
                     __dynamic_cast(local_20,&cmInstallGenerator::typeinfo,
                                    &cmInstallTargetGenerator::typeinfo,0);
      }
      files = (Files *)local_1140;
      if (local_1140 == (cmInstallTargetGenerator *)0x0) {
        if (local_20 == (cmInstallGenerator *)0x0) {
          local_11f8 = (cmInstallFilesGenerator *)0x0;
        }
        else {
          local_11f8 = (cmInstallFilesGenerator *)
                       __dynamic_cast(local_20,&cmInstallGenerator::typeinfo,
                                      &cmInstallFilesGenerator::typeinfo,0);
        }
        files_1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_11f8;
        if (local_11f8 != (cmInstallFilesGenerator *)0x0) {
          cmInstallFilesGenerator::GetFiles(&local_420,local_11f8,this->Config);
          local_408 = &local_420;
          bVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty(local_408);
          if (bVar2) {
            local_21 = 1;
            local_28 = 1;
          }
          else {
            Json::Value::Value(&local_448,"file");
            pVVar4 = Json::Value::operator[](__return_storage_ptr__,"type");
            Json::Value::operator=(pVVar4,&local_448);
            Json::Value::~Value(&local_448);
            cmInstallFilesGenerator::GetDestination
                      ((string *)&paths_1.limit_,(cmInstallFilesGenerator *)files_1,this->Config);
            Json::Value::Value(&local_470,(String *)&paths_1.limit_);
            pVVar4 = Json::Value::operator[](__return_storage_ptr__,"destination");
            Json::Value::operator=(pVVar4,&local_470);
            Json::Value::~Value(&local_470);
            std::__cxx11::string::~string((string *)&paths_1.limit_);
            Json::Value::Value((Value *)&rename,arrayValue);
            cmInstallFilesGenerator::GetRename
                      (&local_4e0,(cmInstallFilesGenerator *)files_1,this->Config);
            local_4c0 = &local_4e0;
            uVar6 = std::__cxx11::string::empty();
            if (((uVar6 & 1) == 0) &&
               (sVar9 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size(local_408), sVar9 == 1)) {
              pvVar8 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](local_408,0);
              DumpInstallerPath((Value *)&__range4,this,&this->TopSource,pvVar8,local_4c0);
              Json::Value::append((Value *)&rename,(Value *)&__range4);
              Json::Value::~Value((Value *)&__range4);
            }
            else {
              cmInstallFilesGenerator::GetFiles
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__begin4,(cmInstallFilesGenerator *)files_1,this->Config);
              __end4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&__begin4);
              file = (string *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__begin4);
              while (bVar2 = __gnu_cxx::operator!=
                                       (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 *)&file), bVar2) {
                local_540 = __gnu_cxx::
                            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator*(&__end4);
                RelativeIfUnder(&local_588,&this->TopSource,local_540);
                Json::Value::Value(&local_568,&local_588);
                Json::Value::append((Value *)&rename,&local_568);
                Json::Value::~Value(&local_568);
                std::__cxx11::string::~string((string *)&local_588);
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&__end4);
              }
              local_28 = 6;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__begin4);
            }
            pVVar4 = Json::Value::operator[](__return_storage_ptr__,"paths");
            Json::Value::operator=(pVVar4,(Value *)&rename);
            bVar2 = cmInstallFilesGenerator::GetOptional((cmInstallFilesGenerator *)files_1);
            if (bVar2) {
              Json::Value::Value((Value *)&installDir,true);
              pVVar4 = Json::Value::operator[](__return_storage_ptr__,"isOptional");
              Json::Value::operator=(pVVar4,(Value *)&installDir);
              Json::Value::~Value((Value *)&installDir);
            }
            std::__cxx11::string::~string((string *)&local_4e0);
            Json::Value::~Value((Value *)&rename);
            local_28 = 0;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_420);
          goto joined_r0x006772db;
        }
        if (local_20 == (cmInstallGenerator *)0x0) {
          local_1248 = (cmInstallDirectoryGenerator *)0x0;
        }
        else {
          local_1248 = (cmInstallDirectoryGenerator *)
                       __dynamic_cast(local_20,&cmInstallGenerator::typeinfo,
                                      &cmInstallDirectoryGenerator::typeinfo,0);
        }
        dirs = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1248;
        if (local_1248 != (cmInstallDirectoryGenerator *)0x0) {
          cmInstallDirectoryGenerator::GetDirectories(&local_5d8,local_1248,this->Config);
          local_5c0 = &local_5d8;
          bVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty(local_5c0);
          if (bVar2) {
            local_21 = 1;
            local_28 = 1;
          }
          else {
            Json::Value::Value(&local_600,"directory");
            pVVar4 = Json::Value::operator[](__return_storage_ptr__,"type");
            Json::Value::operator=(pVVar4,&local_600);
            Json::Value::~Value(&local_600);
            cmInstallDirectoryGenerator::GetDestination
                      ((string *)&paths_2.limit_,(cmInstallDirectoryGenerator *)dirs,this->Config);
            Json::Value::Value(&local_628,(String *)&paths_2.limit_);
            pVVar4 = Json::Value::operator[](__return_storage_ptr__,"destination");
            Json::Value::operator=(pVVar4,&local_628);
            Json::Value::~Value(&local_628);
            std::__cxx11::string::~string((string *)&paths_2.limit_);
            Json::Value::Value((Value *)&__range4_1,arrayValue);
            pvVar11 = local_5c0;
            __end4_1 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin(local_5c0);
            dir = (string *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(pvVar11);
            while( true ) {
              bVar2 = __gnu_cxx::operator!=
                                (&__end4_1,
                                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&dir);
              if (!bVar2) break;
              local_690 = __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&__end4_1);
              str = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_690);
              local_6a0 = str;
              bVar2 = cmHasLiteralSuffix<2ul>(str,(char (*) [2])0xc78192);
              psVar12 = local_690;
              if (bVar2) {
                std::__cxx11::string::size();
                std::__cxx11::string::substr((ulong)&local_6e8,(ulong)psVar12);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_708,".",&local_709);
                DumpInstallerPath(&local_6c8,this,&this->TopSource,&local_6e8,&local_708);
                Json::Value::append((Value *)&__range4_1,&local_6c8);
                Json::Value::~Value(&local_6c8);
                std::__cxx11::string::~string((string *)&local_708);
                std::allocator<char>::~allocator(&local_709);
                std::__cxx11::string::~string((string *)&local_6e8);
              }
              else {
                cmsys::SystemTools::GetFilenameName(&local_758,local_690);
                DumpInstallerPath(&local_738,this,&this->TopSource,psVar12,&local_758);
                Json::Value::append((Value *)&__range4_1,&local_738);
                Json::Value::~Value(&local_738);
                std::__cxx11::string::~string((string *)&local_758);
              }
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end4_1);
            }
            pVVar4 = Json::Value::operator[](__return_storage_ptr__,"paths");
            Json::Value::operator=(pVVar4,(Value *)&__range4_1);
            bVar2 = cmInstallDirectoryGenerator::GetOptional((cmInstallDirectoryGenerator *)dirs);
            if (bVar2) {
              Json::Value::Value((Value *)&installExport,true);
              pVVar4 = Json::Value::operator[](__return_storage_ptr__,"isOptional");
              Json::Value::operator=(pVVar4,(Value *)&installExport);
              Json::Value::~Value((Value *)&installExport);
            }
            Json::Value::~Value((Value *)&__range4_1);
            local_28 = 0;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_5d8);
          goto joined_r0x006772db;
        }
        if (local_20 == (cmInstallGenerator *)0x0) {
          local_12c0 = (cmInstallExportGenerator *)0x0;
        }
        else {
          local_12c0 = (cmInstallExportGenerator *)
                       __dynamic_cast(local_20,&cmInstallGenerator::typeinfo,
                                      &cmInstallExportGenerator::typeinfo,0);
        }
        local_788 = local_12c0;
        if (local_12c0 == (cmInstallExportGenerator *)0x0) {
          if (local_20 == (cmInstallGenerator *)0x0) {
            local_1340 = (cmInstallScriptGenerator *)0x0;
          }
          else {
            local_1340 = (cmInstallScriptGenerator *)
                         __dynamic_cast(local_20,&cmInstallGenerator::typeinfo,
                                        &cmInstallScriptGenerator::typeinfo,0);
          }
          local_8a8 = local_1340;
          if (local_1340 == (cmInstallScriptGenerator *)0x0) {
            if (local_20 == (cmInstallGenerator *)0x0) {
              local_1380 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
            }
            else {
              local_1380 = (cmInstallImportedRuntimeArtifactsGenerator *)
                           __dynamic_cast(local_20,&cmInstallGenerator::typeinfo,
                                          &cmInstallImportedRuntimeArtifactsGenerator::typeinfo,0);
            }
            local_968 = local_1380;
            if (local_1380 == (cmInstallImportedRuntimeArtifactsGenerator *)0x0) {
              if (local_20 == (cmInstallGenerator *)0x0) {
                local_13c0 = (cmInstallRuntimeDependencySetGenerator *)0x0;
              }
              else {
                local_13c0 = (cmInstallRuntimeDependencySetGenerator *)
                             __dynamic_cast(local_20,&cmInstallGenerator::typeinfo,
                                            &cmInstallRuntimeDependencySetGenerator::typeinfo,0);
              }
              local_a08 = local_13c0;
              if (local_13c0 == (cmInstallRuntimeDependencySetGenerator *)0x0) {
                if (local_20 == (cmInstallGenerator *)0x0) {
                  local_1430 = (cmInstallFileSetGenerator *)0x0;
                }
                else {
                  local_1430 = (cmInstallFileSetGenerator *)
                               __dynamic_cast(local_20,&cmInstallGenerator::typeinfo,
                                              &cmInstallFileSetGenerator::typeinfo,0);
                }
                local_b30 = local_1430;
                if (local_1430 == (cmInstallFileSetGenerator *)0x0) {
                  if (local_20 == (cmInstallGenerator *)0x0) {
                    local_1548 = (cmInstallCxxModuleBmiGenerator *)0x0;
                  }
                  else {
                    local_1548 = (cmInstallCxxModuleBmiGenerator *)
                                 __dynamic_cast(local_20,&cmInstallGenerator::typeinfo,
                                                &cmInstallCxxModuleBmiGenerator::typeinfo,0);
                  }
                  local_f40 = local_1548;
                  if (local_1548 != (cmInstallCxxModuleBmiGenerator *)0x0) {
                    Json::Value::Value(&local_f68,"cxxModuleBmi");
                    pVVar4 = Json::Value::operator[](__return_storage_ptr__,"type");
                    Json::Value::operator=(pVVar4,&local_f68);
                    Json::Value::~Value(&local_f68);
                    cmInstallCxxModuleBmiGenerator::GetDestination
                              ((string *)&target_1,local_f40,this->Config);
                    Json::Value::Value(&local_f90,(String *)&target_1);
                    pVVar4 = Json::Value::operator[](__return_storage_ptr__,"destination");
                    Json::Value::operator=(pVVar4,&local_f90);
                    Json::Value::~Value(&local_f90);
                    std::__cxx11::string::~string((string *)&target_1);
                    local_fb8 = cmInstallCxxModuleBmiGenerator::GetTarget(local_f40);
                    Json::Value::Value(&local_fe0,objectValue);
                    pVVar4 = Json::Value::operator[](__return_storage_ptr__,"cxxModuleBmiTarget");
                    Json::Value::operator=(pVVar4,&local_fe0);
                    Json::Value::~Value(&local_fe0);
                    TargetId(&local_1028,local_fb8,&this->TopBuild);
                    Json::Value::Value(&local_1008,&local_1028);
                    pVVar4 = Json::Value::operator[](__return_storage_ptr__,"cxxModuleBmiTarget");
                    pVVar4 = Json::Value::operator[](pVVar4,"id");
                    Json::Value::operator=(pVVar4,&local_1008);
                    Json::Value::~Value(&local_1008);
                    std::__cxx11::string::~string((string *)&local_1028);
                    pmVar5 = std::
                             unordered_map<const_cmGeneratorTarget_*,_unsigned_int,_std::hash<const_cmGeneratorTarget_*>,_std::equal_to<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>_>
                             ::operator[](this->TargetIndexMap,&local_fb8);
                    Json::Value::Value(&local_1050,*pmVar5);
                    pVVar4 = Json::Value::operator[](__return_storage_ptr__,"cxxModuleBmiTarget");
                    pVVar4 = Json::Value::operator[](pVVar4,"index");
                    Json::Value::operator=(pVVar4,&local_1050);
                    Json::Value::~Value(&local_1050);
                    bVar2 = cmInstallCxxModuleBmiGenerator::GetOptional(local_f40);
                    if (bVar2) {
                      Json::Value::Value(&local_1078,true);
                      pVVar4 = Json::Value::operator[](__return_storage_ptr__,"isOptional");
                      Json::Value::operator=(pVVar4,&local_1078);
                      Json::Value::~Value(&local_1078);
                    }
                  }
                }
                else {
                  Json::Value::Value(&local_b58,"fileSet");
                  pVVar4 = Json::Value::operator[](__return_storage_ptr__,"type");
                  Json::Value::operator=(pVVar4,&local_b58);
                  Json::Value::~Value(&local_b58);
                  cmInstallFileSetGenerator::GetDestination
                            ((string *)&fileSet,local_b30,this->Config);
                  Json::Value::Value(&local_b80,(String *)&fileSet);
                  pVVar4 = Json::Value::operator[](__return_storage_ptr__,"destination");
                  Json::Value::operator=(pVVar4,&local_b80);
                  Json::Value::~Value(&local_b80);
                  std::__cxx11::string::~string((string *)&fileSet);
                  this_04 = cmInstallFileSetGenerator::GetFileSet(local_b30);
                  dirCges.
                  super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)cmInstallFileSetGenerator::GetTarget(local_b30);
                  cmFileSet::CompileDirectoryEntries
                            ((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                              *)&dirs_1.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,this_04);
                  pcVar10 = cmGeneratorTarget::GetLocalGenerator
                                      ((cmGeneratorTarget *)
                                       dirCges.
                                       super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  cmFileSet::EvaluateDirectoryEntries
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&entryCges.
                                 super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,this_04,
                             (vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                              *)&dirs_1.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar10,
                             this->Config,
                             (cmGeneratorTarget *)
                             dirCges.
                             super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (cmGeneratorExpressionDAGChecker *)0x0);
                  cmFileSet::CompileFileEntries
                            ((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                              *)&entries._M_t._M_impl.super__Rb_tree_header._M_node_count,this_04);
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         *)&__range9);
                  this_00 = &entries._M_t._M_impl.super__Rb_tree_header._M_node_count;
                  __end9 = std::
                           vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                           ::begin((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                    *)this_00);
                  entryCge = (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                              *)std::
                                vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                ::end((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                       *)this_00);
                  while (bVar2 = __gnu_cxx::operator!=
                                           (&__end9,(
                                                  __normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                                                  *)&entryCge), bVar2) {
                    cge = __gnu_cxx::
                          __normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                          ::operator*(&__end9);
                    files_2.limit_ = (ptrdiff_t)cge;
                    pcVar10 = cmGeneratorTarget::GetLocalGenerator
                                        ((cmGeneratorTarget *)
                                         dirCges.
                                         super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    cmFileSet::EvaluateFileEntry
                              (this_04,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&entryCges.
                                           super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                *)&__range9,cge,pcVar10,this->Config,
                               (cmGeneratorTarget *)
                               dirCges.
                               super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (cmGeneratorExpressionDAGChecker *)0x0);
                    __gnu_cxx::
                    __normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                    ::operator++(&__end9);
                  }
                  Json::Value::Value((Value *)&__range9_1,arrayValue);
                  __end9_1 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                      *)&__range9);
                  it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                          ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                 *)&__range9);
                  while (bVar2 = std::operator!=(&__end9_1,(_Self *)&it), bVar2) {
                    dir_1.field_2._8_8_ =
                         std::
                         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ::operator*(&__end9_1);
                    std::__cxx11::string::string((string *)&__range10,(string *)dir_1.field_2._8_8_)
                    ;
                    uVar6 = std::__cxx11::string::empty();
                    if ((uVar6 & 1) == 0) {
                      std::__cxx11::string::operator+=((string *)&__range10,'/');
                    }
                    pvVar11 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(dir_1.field_2._8_8_ + 0x20);
                    __end10 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::begin(pvVar11);
                    file_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::end(pvVar11);
                    while (bVar2 = __gnu_cxx::operator!=
                                             (&__end10,(
                                                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&file_1), bVar2) {
                      fromPathIn = __gnu_cxx::
                                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ::operator*(&__end10);
                      local_cd0 = fromPathIn;
                      cmAlphaNum::cmAlphaNum(&local_d48,(string *)&__range10);
                      cmsys::SystemTools::GetFilenameName(&local_d98,local_cd0);
                      cmAlphaNum::cmAlphaNum(&local_d78,&local_d98);
                      cmStrCat<>(&local_d18,&local_d48,&local_d78);
                      DumpInstallerPath(&local_cf8,this,&this->TopSource,fromPathIn,&local_d18);
                      Json::Value::append((Value *)&__range9_1,&local_cf8);
                      Json::Value::~Value(&local_cf8);
                      std::__cxx11::string::~string((string *)&local_d18);
                      std::__cxx11::string::~string((string *)&local_d98);
                      __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++(&__end10);
                    }
                    std::__cxx11::string::~string((string *)&__range10);
                    std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::operator++(&__end9_1);
                  }
                  pVVar4 = Json::Value::operator[](__return_storage_ptr__,"paths");
                  Json::Value::operator=(pVVar4,(Value *)&__range9_1);
                  psVar12 = cmFileSet::GetName_abi_cxx11_(this_04);
                  Json::Value::Value(&local_dc0,psVar12);
                  pVVar4 = Json::Value::operator[](__return_storage_ptr__,"fileSetName");
                  Json::Value::operator=(pVVar4,&local_dc0);
                  Json::Value::~Value(&local_dc0);
                  psVar12 = cmFileSet::GetType_abi_cxx11_(this_04);
                  Json::Value::Value(&local_de8,psVar12);
                  pVVar4 = Json::Value::operator[](__return_storage_ptr__,"fileSetType");
                  Json::Value::operator=(pVVar4,&local_de8);
                  Json::Value::~Value(&local_de8);
                  Json::Value::Value((Value *)&__range9_2,arrayValue);
                  pVVar4 = Json::Value::operator[](__return_storage_ptr__,"fileSetDirectories");
                  Json::Value::operator=(pVVar4,(Value *)&__range9_2);
                  Json::Value::~Value((Value *)&__range9_2);
                  this_01 = &entryCges.
                             super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  __end9_2 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)this_01);
                  dir_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)this_01);
                  while (bVar2 = __gnu_cxx::operator!=
                                           (&__end9_2,
                                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&dir_2), bVar2) {
                    local_e30 = __gnu_cxx::
                                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::operator*(&__end9_2);
                    pVVar4 = Json::Value::operator[](__return_storage_ptr__,"fileSetDirectories");
                    RelativeIfUnder(&local_e78,&this->TopSource,local_e30);
                    Json::Value::Value(&local_e58,&local_e78);
                    Json::Value::append(pVVar4,&local_e58);
                    Json::Value::~Value(&local_e58);
                    std::__cxx11::string::~string((string *)&local_e78);
                    __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator++(&__end9_2);
                  }
                  Json::Value::Value(&local_ea0,objectValue);
                  pVVar4 = Json::Value::operator[](__return_storage_ptr__,"fileSetTarget");
                  Json::Value::operator=(pVVar4,&local_ea0);
                  Json::Value::~Value(&local_ea0);
                  TargetId(&local_ee8,
                           (cmGeneratorTarget *)
                           dirCges.
                           super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->TopBuild);
                  Json::Value::Value(&local_ec8,&local_ee8);
                  pVVar4 = Json::Value::operator[](__return_storage_ptr__,"fileSetTarget");
                  pVVar4 = Json::Value::operator[](pVVar4,"id");
                  Json::Value::operator=(pVVar4,&local_ec8);
                  Json::Value::~Value(&local_ec8);
                  std::__cxx11::string::~string((string *)&local_ee8);
                  pmVar5 = std::
                           unordered_map<const_cmGeneratorTarget_*,_unsigned_int,_std::hash<const_cmGeneratorTarget_*>,_std::equal_to<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>_>
                           ::operator[](this->TargetIndexMap,
                                        (key_type *)
                                        &dirCges.
                                         super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  Json::Value::Value(&local_f10,*pmVar5);
                  pVVar4 = Json::Value::operator[](__return_storage_ptr__,"fileSetTarget");
                  pVVar4 = Json::Value::operator[](pVVar4,"index");
                  Json::Value::operator=(pVVar4,&local_f10);
                  Json::Value::~Value(&local_f10);
                  bVar2 = cmInstallFileSetGenerator::GetOptional(local_b30);
                  if (bVar2) {
                    Json::Value::Value((Value *)&cxxModuleBmi,true);
                    pVVar4 = Json::Value::operator[](__return_storage_ptr__,"isOptional");
                    Json::Value::operator=(pVVar4,(Value *)&cxxModuleBmi);
                    Json::Value::~Value((Value *)&cxxModuleBmi);
                  }
                  Json::Value::~Value((Value *)&__range9_1);
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                          *)&__range9);
                  std::
                  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                  ::~vector((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                             *)&entries._M_t._M_impl.super__Rb_tree_header._M_node_count);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&entryCges.
                                super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  std::
                  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                  ::~vector((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                             *)&dirs_1.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                }
              }
              else {
                Json::Value::Value(&local_a30,"runtimeDependencySet");
                pVVar4 = Json::Value::operator[](__return_storage_ptr__,"type");
                Json::Value::operator=(pVVar4,&local_a30);
                Json::Value::~Value(&local_a30);
                cmInstallRuntimeDependencySetGenerator::GetDestination
                          ((string *)((long)&name.field_2 + 8),local_a08,this->Config);
                Json::Value::Value(&local_a58,(String *)((long)&name.field_2 + 8));
                pVVar4 = Json::Value::operator[](__return_storage_ptr__,"destination");
                Json::Value::operator=(pVVar4,&local_a58);
                Json::Value::~Value(&local_a58);
                std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
                this_03 = cmInstallRuntimeDependencySetGenerator::GetRuntimeDependencySet(local_a08)
                ;
                local_aa8 = cmInstallRuntimeDependencySet::GetName(this_03);
                std::allocator<char>::allocator();
                std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          ((string *)local_a98,&local_aa8,&local_aa9);
                std::allocator<char>::~allocator(&local_aa9);
                uVar6 = std::__cxx11::string::empty();
                if ((uVar6 & 1) == 0) {
                  Json::Value::Value(&local_ad8,(String *)local_a98);
                  pVVar4 = Json::Value::operator[]
                                     (__return_storage_ptr__,"runtimeDependencySetName");
                  Json::Value::operator=(pVVar4,&local_ad8);
                  Json::Value::~Value(&local_ad8);
                }
                DVar3 = cmInstallRuntimeDependencySetGenerator::GetDependencyType(local_a08);
                if (DVar3 == Library) {
                  Json::Value::Value((Value *)&installFileSet,"library");
                  pVVar4 = Json::Value::operator[]
                                     (__return_storage_ptr__,"runtimeDependencySetType");
                  Json::Value::operator=(pVVar4,(Value *)&installFileSet);
                  Json::Value::~Value((Value *)&installFileSet);
                }
                else if (DVar3 == Framework) {
                  Json::Value::Value(&local_b00,"framework");
                  pVVar4 = Json::Value::operator[]
                                     (__return_storage_ptr__,"runtimeDependencySetType");
                  Json::Value::operator=(pVVar4,&local_b00);
                  Json::Value::~Value(&local_b00);
                }
                std::__cxx11::string::~string((string *)local_a98);
              }
            }
            else {
              Json::Value::Value(&local_990,"importedRuntimeArtifacts");
              pVVar4 = Json::Value::operator[](__return_storage_ptr__,"type");
              Json::Value::operator=(pVVar4,&local_990);
              Json::Value::~Value(&local_990);
              cmInstallImportedRuntimeArtifactsGenerator::GetDestination
                        (&local_9d8,local_968,this->Config);
              Json::Value::Value(&local_9b8,&local_9d8);
              pVVar4 = Json::Value::operator[](__return_storage_ptr__,"destination");
              Json::Value::operator=(pVVar4,&local_9b8);
              Json::Value::~Value(&local_9b8);
              std::__cxx11::string::~string((string *)&local_9d8);
              bVar2 = cmInstallImportedRuntimeArtifactsGenerator::GetOptional(local_968);
              if (bVar2) {
                Json::Value::Value((Value *)&installRuntimeDependencySet,true);
                pVVar4 = Json::Value::operator[](__return_storage_ptr__,"isOptional");
                Json::Value::operator=(pVVar4,(Value *)&installRuntimeDependencySet);
                Json::Value::~Value((Value *)&installRuntimeDependencySet);
              }
            }
          }
          else {
            bVar2 = cmInstallScriptGenerator::IsCode(local_1340);
            if (bVar2) {
              Json::Value::Value(&local_8d0,"code");
              pVVar4 = Json::Value::operator[](__return_storage_ptr__,"type");
              Json::Value::operator=(pVVar4,&local_8d0);
              Json::Value::~Value(&local_8d0);
            }
            else {
              Json::Value::Value(&local_8f8,"script");
              pVVar4 = Json::Value::operator[](__return_storage_ptr__,"type");
              Json::Value::operator=(pVVar4,&local_8f8);
              Json::Value::~Value(&local_8f8);
              cmInstallScriptGenerator::GetScript
                        ((string *)&installImportedRuntimeArtifacts,local_8a8,this->Config);
              RelativeIfUnder(&local_940,&this->TopSource,(string *)&installImportedRuntimeArtifacts
                             );
              Json::Value::Value(&local_920,&local_940);
              pVVar4 = Json::Value::operator[](__return_storage_ptr__,"scriptFile");
              Json::Value::operator=(pVVar4,&local_920);
              Json::Value::~Value(&local_920);
              std::__cxx11::string::~string((string *)&local_940);
              std::__cxx11::string::~string((string *)&installImportedRuntimeArtifacts);
            }
          }
        }
        else {
          Json::Value::Value(&local_7b0,"export");
          pVVar4 = Json::Value::operator[](__return_storage_ptr__,"type");
          Json::Value::operator=(pVVar4,&local_7b0);
          Json::Value::~Value(&local_7b0);
          psVar12 = cmInstallExportGenerator::GetDestination_abi_cxx11_(local_788);
          Json::Value::Value((Value *)&exportSet,psVar12);
          pVVar4 = Json::Value::operator[](__return_storage_ptr__,"destination");
          Json::Value::operator=(pVVar4,(Value *)&exportSet);
          Json::Value::~Value((Value *)&exportSet);
          local_7e0 = cmInstallExportGenerator::GetExportSet(local_788);
          psVar12 = cmExportSet::GetName_abi_cxx11_(local_7e0);
          Json::Value::Value(&local_808,psVar12);
          pVVar4 = Json::Value::operator[](__return_storage_ptr__,"exportName");
          Json::Value::operator=(pVVar4,&local_808);
          Json::Value::~Value(&local_808);
          DumpInstallerExportTargets((Value *)&paths_3.limit_,this,local_7e0);
          pVVar4 = Json::Value::operator[](__return_storage_ptr__,"exportTargets");
          Json::Value::operator=(pVVar4,(Value *)&paths_3.limit_);
          Json::Value::~Value((Value *)&paths_3.limit_);
          Json::Value::Value((Value *)local_858,arrayValue);
          psVar12 = cmInstallExportGenerator::GetMainImportFile_abi_cxx11_(local_788);
          RelativeIfUnder((string *)&installScript,&this->TopBuild,psVar12);
          Json::Value::Value(&local_880,(String *)&installScript);
          Json::Value::append((Value *)local_858,&local_880);
          Json::Value::~Value(&local_880);
          std::__cxx11::string::~string((string *)&installScript);
          pVVar4 = Json::Value::operator[](__return_storage_ptr__,"paths");
          Json::Value::operator=(pVVar4,(Value *)local_858);
          Json::Value::~Value((Value *)local_858);
        }
      }
      else {
        cmInstallTargetGenerator::GetFiles(&local_c8,local_1140,this->Config);
        local_48 = &local_c8;
        bVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&local_48->From);
        if (bVar2) {
          local_21 = 1;
          local_28 = 1;
        }
        else {
          Json::Value::Value(&local_f0,"target");
          pVVar4 = Json::Value::operator[](__return_storage_ptr__,"type");
          Json::Value::operator=(pVVar4,&local_f0);
          Json::Value::~Value(&local_f0);
          cmInstallTargetGenerator::GetDestination
                    (&local_138,(cmInstallTargetGenerator *)files,this->Config);
          Json::Value::Value(&local_118,&local_138);
          pVVar4 = Json::Value::operator[](__return_storage_ptr__,"destination");
          Json::Value::operator=(pVVar4,&local_118);
          Json::Value::~Value(&local_118);
          std::__cxx11::string::~string((string *)&local_138);
          gt = cmInstallTargetGenerator::GetTarget((cmInstallTargetGenerator *)files);
          TargetId(&local_180,gt,&this->TopBuild);
          Json::Value::Value(&local_160,&local_180);
          pVVar4 = Json::Value::operator[](__return_storage_ptr__,"targetId");
          Json::Value::operator=(pVVar4,&local_160);
          Json::Value::~Value(&local_160);
          std::__cxx11::string::~string((string *)&local_180);
          this_02 = this->TargetIndexMap;
          fromDir.field_2._8_8_ =
               cmInstallTargetGenerator::GetTarget((cmInstallTargetGenerator *)files);
          pmVar5 = std::
                   unordered_map<const_cmGeneratorTarget_*,_unsigned_int,_std::hash<const_cmGeneratorTarget_*>,_std::equal_to<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>_>
                   ::operator[](this_02,(key_type *)((long)&fromDir.field_2 + 8));
          Json::Value::Value(&local_1a8,*pmVar5);
          pVVar4 = Json::Value::operator[](__return_storage_ptr__,"targetIndex");
          Json::Value::operator=(pVVar4,&local_1a8);
          Json::Value::~Value(&local_1a8);
          std::__cxx11::string::string
                    ((string *)(toDir.field_2._M_local_buf + 8),(string *)&local_48->FromDir);
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            std::__cxx11::string::push_back((char)&toDir + '\x18');
          }
          std::__cxx11::string::string((string *)&paths.limit_,(string *)&local_48->ToDir);
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            std::__cxx11::string::push_back((char)&paths + ' ');
          }
          Json::Value::Value((Value *)&i,arrayValue);
          for (fromPath = (string *)0x0; psVar12 = fromPath,
              psVar7 = (string *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size(&local_48->From), psVar12 < psVar7;
              fromPath = (string *)&fromPath->field_0x1) {
            cmAlphaNum::cmAlphaNum(&local_278,(string *)((long)&toDir.field_2 + 8));
            pvVar8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&local_48->From,(size_type)fromPath);
            cmAlphaNum::cmAlphaNum((cmAlphaNum *)&toPath,pvVar8);
            cmStrCat<>(&local_248,&local_278,(cmAlphaNum *)&toPath);
            local_228 = &local_248;
            cmAlphaNum::cmAlphaNum(&local_300,(string *)&paths.limit_);
            pvVar8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&local_48->To,(size_type)fromPath);
            cmAlphaNum::cmAlphaNum(&local_330,pvVar8);
            cmStrCat<>(&local_2d0,&local_300,&local_330);
            local_2b0 = &local_2d0;
            DumpInstallerPath(&local_358,this,&this->TopBuild,local_228,local_2b0);
            Json::Value::append((Value *)&i,&local_358);
            Json::Value::~Value(&local_358);
            std::__cxx11::string::~string((string *)&local_2d0);
            std::__cxx11::string::~string((string *)&local_248);
          }
          pVVar4 = Json::Value::operator[](__return_storage_ptr__,"paths");
          Json::Value::operator=(pVVar4,(Value *)&i);
          bVar2 = cmInstallTargetGenerator::GetOptional((cmInstallTargetGenerator *)files);
          if (bVar2) {
            Json::Value::Value(&local_380,true);
            pVVar4 = Json::Value::operator[](__return_storage_ptr__,"isOptional");
            Json::Value::operator=(pVVar4,&local_380);
            Json::Value::~Value(&local_380);
          }
          bVar2 = cmInstallTargetGenerator::IsImportLibrary((cmInstallTargetGenerator *)files);
          if (bVar2) {
            Json::Value::Value(&local_3a8,true);
            pVVar4 = Json::Value::operator[](__return_storage_ptr__,"targetIsImportLibrary");
            Json::Value::operator=(pVVar4,&local_3a8);
            Json::Value::~Value(&local_3a8);
          }
          NVar1 = local_48->NamelinkMode;
          if (NVar1 != NamelinkModeNone) {
            if (NVar1 == NamelinkModeOnly) {
              Json::Value::Value(&local_3d0,"only");
              pVVar4 = Json::Value::operator[](__return_storage_ptr__,"targetInstallNamelink");
              Json::Value::operator=(pVVar4,&local_3d0);
              Json::Value::~Value(&local_3d0);
            }
            else if (NVar1 == NamelinkModeSkip) {
              Json::Value::Value((Value *)&installFiles,"skip");
              pVVar4 = Json::Value::operator[](__return_storage_ptr__,"targetInstallNamelink");
              Json::Value::operator=(pVVar4,(Value *)&installFiles);
              Json::Value::~Value((Value *)&installFiles);
            }
          }
          Json::Value::~Value((Value *)&i);
          std::__cxx11::string::~string((string *)&paths.limit_);
          std::__cxx11::string::~string((string *)(toDir.field_2._M_local_buf + 8));
          local_28 = 0;
        }
        cmInstallTargetGenerator::Files::~Files(&local_c8);
joined_r0x006772db:
        if (local_28 != 0) goto LAB_0067974b;
      }
      psVar12 = cmInstallGenerator::GetComponent_abi_cxx11_(local_20);
      Json::Value::Value(&local_10a0,psVar12);
      pVVar4 = Json::Value::operator[](__return_storage_ptr__,"component");
      Json::Value::operator=(pVVar4,&local_10a0);
      Json::Value::~Value(&local_10a0);
      bVar2 = cmInstallGenerator::GetExcludeFromAll(local_20);
      if (bVar2) {
        Json::Value::Value(&local_10c8,true);
        pVVar4 = Json::Value::operator[](__return_storage_ptr__,"isExcludeFromAll");
        Json::Value::operator=(pVVar4,&local_10c8);
        Json::Value::~Value(&local_10c8);
      }
      bVar2 = cmInstallGenerator::GetAllComponentsFlag(local_20);
      if (bVar2) {
        Json::Value::Value(&local_10f0,true);
        pVVar4 = Json::Value::operator[](__return_storage_ptr__,"isForAllComponents");
        Json::Value::operator=(pVVar4,&local_10f0);
        Json::Value::~Value(&local_10f0);
      }
      bt = cmInstallGenerator::GetBacktrace(local_20);
      AddBacktrace(this,__return_storage_ptr__,bt);
      local_21 = 1;
      local_28 = 1;
      goto LAB_0067974b;
    }
  }
  local_21 = 1;
  local_28 = 1;
LAB_0067974b:
  if ((local_21 & 1) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value DirectoryObject::DumpInstaller(cmInstallGenerator* gen)
{
  assert(gen);
  Json::Value installer = Json::objectValue;

  // Exclude subdirectory installers and file(GET_RUNTIME_DEPENDENCIES)
  // installers. They are implementation details.
  if (dynamic_cast<cmInstallSubdirectoryGenerator*>(gen) ||
      dynamic_cast<cmInstallGetRuntimeDependenciesGenerator*>(gen)) {
    return installer;
  }

  // Exclude installers not used in this configuration.
  if (!gen->InstallsForConfig(this->Config)) {
    return installer;
  }

  // Add fields specific to each kind of install generator.
  if (auto* installTarget = dynamic_cast<cmInstallTargetGenerator*>(gen)) {
    cmInstallTargetGenerator::Files const& files =
      installTarget->GetFiles(this->Config);
    if (files.From.empty()) {
      return installer;
    }

    installer["type"] = "target";
    installer["destination"] = installTarget->GetDestination(this->Config);
    installer["targetId"] =
      TargetId(installTarget->GetTarget(), this->TopBuild);
    installer["targetIndex"] =
      this->TargetIndexMap[installTarget->GetTarget()];

    std::string fromDir = files.FromDir;
    if (!fromDir.empty()) {
      fromDir.push_back('/');
    }

    std::string toDir = files.ToDir;
    if (!toDir.empty()) {
      toDir.push_back('/');
    }

    Json::Value paths = Json::arrayValue;
    for (size_t i = 0; i < files.From.size(); ++i) {
      std::string const& fromPath = cmStrCat(fromDir, files.From[i]);
      std::string const& toPath = cmStrCat(toDir, files.To[i]);
      paths.append(this->DumpInstallerPath(this->TopBuild, fromPath, toPath));
    }
    installer["paths"] = std::move(paths);

    if (installTarget->GetOptional()) {
      installer["isOptional"] = true;
    }

    if (installTarget->IsImportLibrary()) {
      installer["targetIsImportLibrary"] = true;
    }

    switch (files.NamelinkMode) {
      case cmInstallTargetGenerator::NamelinkModeNone:
        break;
      case cmInstallTargetGenerator::NamelinkModeOnly:
        installer["targetInstallNamelink"] = "only";
        break;
      case cmInstallTargetGenerator::NamelinkModeSkip:
        installer["targetInstallNamelink"] = "skip";
        break;
    }

    // FIXME: Parse FilePermissions to provide structured information.
    // FIXME: Thread EXPORT name through from install() call.
  } else if (auto* installFiles =
               dynamic_cast<cmInstallFilesGenerator*>(gen)) {
    std::vector<std::string> const& files =
      installFiles->GetFiles(this->Config);
    if (files.empty()) {
      return installer;
    }

    installer["type"] = "file";
    installer["destination"] = installFiles->GetDestination(this->Config);
    Json::Value paths = Json::arrayValue;
    std::string const& rename = installFiles->GetRename(this->Config);
    if (!rename.empty() && files.size() == 1) {
      paths.append(this->DumpInstallerPath(this->TopSource, files[0], rename));
    } else {
      for (std::string const& file : installFiles->GetFiles(this->Config)) {
        paths.append(RelativeIfUnder(this->TopSource, file));
      }
    }
    installer["paths"] = std::move(paths);
    if (installFiles->GetOptional()) {
      installer["isOptional"] = true;
    }
    // FIXME: Parse FilePermissions to provide structured information.
  } else if (auto* installDir =
               dynamic_cast<cmInstallDirectoryGenerator*>(gen)) {
    std::vector<std::string> const& dirs =
      installDir->GetDirectories(this->Config);
    if (dirs.empty()) {
      return installer;
    }

    installer["type"] = "directory";
    installer["destination"] = installDir->GetDestination(this->Config);
    Json::Value paths = Json::arrayValue;
    for (std::string const& dir : dirs) {
      if (cmHasLiteralSuffix(dir, "/")) {
        paths.append(this->DumpInstallerPath(
          this->TopSource, dir.substr(0, dir.size() - 1), "."));
      } else {
        paths.append(this->DumpInstallerPath(
          this->TopSource, dir, cmSystemTools::GetFilenameName(dir)));
      }
    }
    installer["paths"] = std::move(paths);
    if (installDir->GetOptional()) {
      installer["isOptional"] = true;
    }
    // FIXME: Parse FilePermissions, DirPermissions, and LiteralArguments.
    // to provide structured information.
  } else if (auto* installExport =
               dynamic_cast<cmInstallExportGenerator*>(gen)) {
    installer["type"] = "export";
    installer["destination"] = installExport->GetDestination();
    cmExportSet* exportSet = installExport->GetExportSet();
    installer["exportName"] = exportSet->GetName();
    installer["exportTargets"] = this->DumpInstallerExportTargets(exportSet);
    Json::Value paths = Json::arrayValue;
    paths.append(
      RelativeIfUnder(this->TopBuild, installExport->GetMainImportFile()));
    installer["paths"] = std::move(paths);
  } else if (auto* installScript =
               dynamic_cast<cmInstallScriptGenerator*>(gen)) {
    if (installScript->IsCode()) {
      installer["type"] = "code";
    } else {
      installer["type"] = "script";
      installer["scriptFile"] = RelativeIfUnder(
        this->TopSource, installScript->GetScript(this->Config));
    }
  } else if (auto* installImportedRuntimeArtifacts =
               dynamic_cast<cmInstallImportedRuntimeArtifactsGenerator*>(
                 gen)) {
    installer["type"] = "importedRuntimeArtifacts";
    installer["destination"] =
      installImportedRuntimeArtifacts->GetDestination(this->Config);
    if (installImportedRuntimeArtifacts->GetOptional()) {
      installer["isOptional"] = true;
    }
  } else if (auto* installRuntimeDependencySet =
               dynamic_cast<cmInstallRuntimeDependencySetGenerator*>(gen)) {
    installer["type"] = "runtimeDependencySet";
    installer["destination"] =
      installRuntimeDependencySet->GetDestination(this->Config);
    std::string name(
      installRuntimeDependencySet->GetRuntimeDependencySet()->GetName());
    if (!name.empty()) {
      installer["runtimeDependencySetName"] = name;
    }
    switch (installRuntimeDependencySet->GetDependencyType()) {
      case cmInstallRuntimeDependencySetGenerator::DependencyType::Framework:
        installer["runtimeDependencySetType"] = "framework";
        break;
      case cmInstallRuntimeDependencySetGenerator::DependencyType::Library:
        installer["runtimeDependencySetType"] = "library";
        break;
    }
  } else if (auto* installFileSet =
               dynamic_cast<cmInstallFileSetGenerator*>(gen)) {
    installer["type"] = "fileSet";
    installer["destination"] = installFileSet->GetDestination(this->Config);

    auto* fileSet = installFileSet->GetFileSet();
    auto* target = installFileSet->GetTarget();

    auto dirCges = fileSet->CompileDirectoryEntries();
    auto dirs = fileSet->EvaluateDirectoryEntries(
      dirCges, target->GetLocalGenerator(), this->Config, target);

    auto entryCges = fileSet->CompileFileEntries();
    std::map<std::string, std::vector<std::string>> entries;
    for (auto const& entryCge : entryCges) {
      fileSet->EvaluateFileEntry(dirs, entries, entryCge,
                                 target->GetLocalGenerator(), this->Config,
                                 target);
    }

    Json::Value files = Json::arrayValue;
    for (auto const& it : entries) {
      auto dir = it.first;
      if (!dir.empty()) {
        dir += '/';
      }
      for (auto const& file : it.second) {
        files.append(this->DumpInstallerPath(
          this->TopSource, file,
          cmStrCat(dir, cmSystemTools::GetFilenameName(file))));
      }
    }
    installer["paths"] = std::move(files);
    installer["fileSetName"] = fileSet->GetName();
    installer["fileSetType"] = fileSet->GetType();
    installer["fileSetDirectories"] = Json::arrayValue;
    for (auto const& dir : dirs) {
      installer["fileSetDirectories"].append(
        RelativeIfUnder(this->TopSource, dir));
    }
    installer["fileSetTarget"] = Json::objectValue;
    installer["fileSetTarget"]["id"] = TargetId(target, this->TopBuild);
    installer["fileSetTarget"]["index"] = this->TargetIndexMap[target];

    if (installFileSet->GetOptional()) {
      installer["isOptional"] = true;
    }
  } else if (auto* cxxModuleBmi =
               dynamic_cast<cmInstallCxxModuleBmiGenerator*>(gen)) {
    installer["type"] = "cxxModuleBmi";
    installer["destination"] = cxxModuleBmi->GetDestination(this->Config);

    auto const* target = cxxModuleBmi->GetTarget();
    installer["cxxModuleBmiTarget"] = Json::objectValue;
    installer["cxxModuleBmiTarget"]["id"] = TargetId(target, this->TopBuild);
    installer["cxxModuleBmiTarget"]["index"] = this->TargetIndexMap[target];

    // FIXME: Parse FilePermissions.
    // FIXME: Parse MessageLevel.
    if (cxxModuleBmi->GetOptional()) {
      installer["isOptional"] = true;
    }
  }

  // Add fields common to all install generators.
  installer["component"] = gen->GetComponent();
  if (gen->GetExcludeFromAll()) {
    installer["isExcludeFromAll"] = true;
  }

  if (gen->GetAllComponentsFlag()) {
    installer["isForAllComponents"] = true;
  }

  this->AddBacktrace(installer, gen->GetBacktrace());

  return installer;
}